

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnarySelectPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnarySelectPropertyExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SelectorSyntax*&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,SelectorSyntax **args_2,Token *args_3,
          PropertyExprSyntax *args_4)

{
  Token op;
  Token openBracket;
  Token closeBracket;
  UnarySelectPropertyExprSyntax *this_00;
  PropertyExprSyntax *args_local_4;
  Token *args_local_3;
  SelectorSyntax **args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (UnarySelectPropertyExprSyntax *)allocate(this,0x50,8);
  op.kind = args->kind;
  op._2_1_ = args->field_0x2;
  op.numFlags.raw = (args->numFlags).raw;
  op.rawLen = args->rawLen;
  op.info = args->info;
  openBracket.kind = args_1->kind;
  openBracket._2_1_ = args_1->field_0x2;
  openBracket.numFlags.raw = (args_1->numFlags).raw;
  openBracket.rawLen = args_1->rawLen;
  openBracket.info = args_1->info;
  closeBracket.kind = args_3->kind;
  closeBracket._2_1_ = args_3->field_0x2;
  closeBracket.numFlags.raw = (args_3->numFlags).raw;
  closeBracket.rawLen = args_3->rawLen;
  closeBracket.info = args_3->info;
  slang::syntax::UnarySelectPropertyExprSyntax::UnarySelectPropertyExprSyntax
            (this_00,op,openBracket,*args_2,closeBracket,args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }